

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::ArrayBuilder<kj::TreeMap<kj::String,_int>::Entry>::removeLast
          (ArrayBuilder<kj::TreeMap<kj::String,_int>::Entry> *this)

{
  long lVar1;
  
  lVar1 = *(long *)(this + 8);
  *(Array<char> **)(this + 8) = (Array<char> *)(lVar1 + -0x20);
  Array<char>::~Array((Array<char> *)(lVar1 + -0x20));
  return;
}

Assistant:

void removeLast() {
    KJ_IREQUIRE(pos > ptr, "No elements present to remove.");
    kj::dtor(*--pos);
  }